

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall
ExprTest_EqualNumericConstant_Test::TestBody(ExprTest_EqualNumericConstant_Test *this)

{
  bool bVar1;
  NumericConstant NVar2;
  NumericConstant NVar3;
  ExprFactory *this_00;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  
  this_00 = &(this->super_ExprTest).factory_;
  NVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.42);
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.42);
  local_40[0] = (internal)
                mp::Equal((Expr)NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.
                                super_ExprBase.impl_,
                          (Expr)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.
                                super_ExprBase.impl_);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"Equal(MakeConst(0.42), MakeConst(0.42))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2ca
               ,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  NVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.42);
  NVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,42.0);
  bVar1 = mp::Equal((Expr)NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase
                          .impl_,
                    (Expr)NVar3.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase
                          .impl_);
  local_40[0] = (internal)!bVar1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"Equal(MakeConst(0.42), MakeConst(42))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2cb
               ,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, EqualNumericConstant) {
  EXPECT_TRUE(Equal(MakeConst(0.42), MakeConst(0.42)));
  EXPECT_FALSE(Equal(MakeConst(0.42), MakeConst(42)));
}